

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::ConsoleReporter::subcase_end(ConsoleReporter *this)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffff0,in_RDI);
  *(long *)((long)&in_RDI[1].super___mutex_base._M_mutex + 8) =
       *(long *)((long)&in_RDI[1].super___mutex_base._M_mutex + 8) + -1;
  (in_RDI->super___mutex_base)._M_mutex.__size[0x10] = '\0';
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11fafe);
  return;
}

Assistant:

void subcase_end() override {
            std::lock_guard<std::mutex> lock(mutex);
            --currentSubcaseLevel;
            hasLoggedCurrentTestStart = false;
        }